

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Opnd * __thiscall Lowerer::GetFuncObjectOpnd(Lowerer *this,Instr *insertBeforeInstr)

{
  undefined1 *puVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  SymOpnd *src;
  StackSym *stackSym;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar5;
  
  this_00 = insertBeforeInstr->m_func;
  bVar3 = Func::IsInlinee(this_00);
  if (bVar3) {
    src = Func::GetInlineeFunctionObjectSlotOpnd(this_00);
  }
  else {
    stackSym = StackSym::New(TyInt64,this->m_func);
    Func::SetArgOffset(this->m_func,stackSym,0x10);
    puVar1 = &this->m_func->field_0x240;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
    src = IR::SymOpnd::New(&stackSym->super_Sym,TyInt64,this->m_func);
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this_00->m_workItem);
  bVar3 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar3) {
    bVar3 = Func::IsInlinee(this_00);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3557,"(!func->IsInlinee())","!func->IsInlinee()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    baseOpnd = IR::RegOpnd::New(TyInt64,this_00);
    InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
    pIVar5 = IR::IndirOpnd::New(baseOpnd,0x48,TyUint64,this_00,false);
    return &pIVar5->super_Opnd;
  }
  return &src->super_Opnd;
}

Assistant:

IR::Opnd*
Lowerer::GetFuncObjectOpnd(IR::Instr* insertBeforeInstr)
{
    Func * func = insertBeforeInstr->m_func;
    IR::Opnd *paramOpnd = nullptr;
    if (func->IsInlinee())
    {
        paramOpnd = func->GetInlineeFunctionObjectSlotOpnd();
    }
    else
    {
#if defined(_M_ARM32_OR_ARM64)
        StackSym * paramSym = this->m_lowererMD.GetImplicitParamSlotSym(0);
#else
        StackSym *paramSym = StackSym::New(TyMachReg, this->m_func);
        this->m_func->SetArgOffset(paramSym, 2 * MachPtr);
        this->m_func->SetHasImplicitParamLoad();
#endif
        paramOpnd = IR::SymOpnd::New(paramSym, TyMachReg, this->m_func);
    }

    if (func->GetJITFunctionBody()->IsCoroutine())
    {
        // the function object for generator calls is a GeneratorVirtualScriptFunction object
        // and we need to return the real JavascriptGeneratorFunction object so grab it before
        // assigning to the dst
        Assert(!func->IsInlinee());
        IR::RegOpnd *tmpOpnd = IR::RegOpnd::New(TyMachReg, func);
        Lowerer::InsertMove(tmpOpnd, paramOpnd, insertBeforeInstr);

        paramOpnd = IR::IndirOpnd::New(tmpOpnd, Js::GeneratorVirtualScriptFunction::GetRealFunctionOffset(), TyMachPtr, func);
    }
    return paramOpnd;
}